

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O2

int __thiscall Fl_Input_::static_value(Fl_Input_ *this,char *str,int len)

{
  uint *puVar1;
  uint uVar2;
  char *pcVar3;
  ulong uVar4;
  int p;
  uint uVar5;
  ulong uVar6;
  
  puVar1 = &(this->super_Fl_Widget).flags_;
  *(byte *)puVar1 = (byte)*puVar1 & 0x7f;
  if (undowidget == this) {
    undowidget = (Fl_Input_ *)0x0;
  }
  pcVar3 = this->value_;
  uVar2 = this->size_;
  if (pcVar3 == str && uVar2 == len) {
    return 0;
  }
  if (len == 0) {
    if (uVar2 == 0) {
      return 0;
    }
    this->size_ = 0;
    this->value_ = "";
    this->xscroll_ = 0;
    this->yscroll_ = 0;
    minimal_update(this,0);
    len = this->size_;
    goto LAB_001870d6;
  }
  if (this->yscroll_ == 0 && this->xscroll_ == 0) {
    if (pcVar3 == (char *)0x0) goto LAB_001870c2;
    uVar5 = len;
    if ((int)uVar2 < len) {
      uVar5 = uVar2;
    }
    uVar6 = (ulong)uVar5;
    uVar4 = 0;
    if ((int)uVar5 < 1) {
      uVar6 = 0;
    }
    for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
      if (str[uVar4] != pcVar3[uVar4]) {
        uVar6 = uVar4 & 0xffffffff;
        break;
      }
    }
    uVar5 = (uint)uVar6;
    if (uVar5 == len && uVar2 == uVar5) {
      return 0;
    }
  }
  else {
    this->xscroll_ = 0;
    this->yscroll_ = 0;
LAB_001870c2:
    uVar5 = 0;
  }
  minimal_update(this,uVar5);
  this->value_ = str;
  this->size_ = len;
LAB_001870d6:
  p = 0;
  if (((this->super_Fl_Widget).type_ & 8) == 0) {
    p = len;
  }
  position(this,p);
  return 1;
}

Assistant:

int Fl_Input_::static_value(const char* str, int len) {
  clear_changed();
  if (undowidget == this) undowidget = 0;
  if (str == value_ && len == size_) return 0;
  if (len) { // non-empty new value:
    if (xscroll_ || yscroll_) {
      xscroll_ = yscroll_ = 0;
      minimal_update(0);
    } else {
      int i = 0;
      // find first different character:
      if (value_) {
	for (; i<size_ && i<len && str[i]==value_[i]; i++) {/*empty*/}
	if (i==size_ && i==len) return 0;
      }
      minimal_update(i);
    }
    value_ = str;
    size_ = len;
  } else { // empty new value:
    if (!size_) return 0; // both old and new are empty.
    size_ = 0;
    value_ = "";
    xscroll_ = yscroll_ = 0;
    minimal_update(0);
  }
  position(readonly() ? 0 : size());
  return 1;
}